

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O3

void protect_up(refs_table_t *tbl,uint64_t a)

{
  uint64_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint64_t *puVar4;
  ulong uVar5;
  uint64_t *puVar6;
  int iVar7;
  bool bVar8;
  
  do {
    while (uVar2 = tbl->refs_control, 0xfffffff < uVar2) {
      do {
        iVar7 = protect_resize_help(tbl);
      } while (iVar7 != 0);
    }
    LOCK();
    bVar8 = uVar2 == tbl->refs_control;
    if (bVar8) {
      tbl->refs_control = uVar2 + 1;
    }
    UNLOCK();
  } while (!bVar8);
  uVar5 = ((a >> 0x27 | a << 0x19) ^ (a ^ 0xcbf29ce484222325) * 0x100000001b3) * 0x100000001b3;
LAB_00112c02:
  do {
    iVar7 = 0x7f;
    puVar6 = (uint64_t *)0x0;
    puVar4 = tbl->refs_table + (tbl->refs_size - 1 & (uVar5 >> 0x20 ^ uVar5));
    do {
      while (*puVar4 == 0) {
        if (puVar6 != (uint64_t *)0x0) {
          LOCK();
          uVar1 = *puVar6;
          if (uVar1 == 0x7fffffffffffffff) {
            *puVar6 = a;
          }
          UNLOCK();
          if (uVar1 == 0x7fffffffffffffff) {
            do {
              uVar3 = tbl->refs_control;
              LOCK();
              bVar8 = uVar3 == tbl->refs_control;
              if (bVar8) {
                tbl->refs_control = uVar3 - 1;
              }
              UNLOCK();
            } while (!bVar8);
            return;
          }
          goto LAB_00112c02;
        }
        LOCK();
        uVar1 = *puVar4;
        if (uVar1 == 0) {
          *puVar4 = a;
        }
        UNLOCK();
        if (uVar1 == 0) {
          do {
            uVar3 = tbl->refs_control;
            LOCK();
            bVar8 = uVar3 == tbl->refs_control;
            if (bVar8) {
              tbl->refs_control = uVar3 - 1;
            }
            UNLOCK();
          } while (!bVar8);
          return;
        }
      }
      if ((*puVar4 == 0x7fffffffffffffff) && (puVar6 == (uint64_t *)0x0)) {
        puVar6 = puVar4;
      }
      puVar4 = puVar4 + 1;
      if (puVar4 == tbl->refs_table + tbl->refs_size) {
        puVar4 = tbl->refs_table;
      }
      bVar8 = iVar7 != 0;
      iVar7 = iVar7 + -1;
    } while (bVar8);
    if (puVar6 == (uint64_t *)0x0) {
      do {
        uVar3 = tbl->refs_control;
        LOCK();
        bVar8 = uVar3 == tbl->refs_control;
        if (bVar8) {
          tbl->refs_control = uVar3 - 1;
        }
        UNLOCK();
      } while (!bVar8);
      while (uVar2 = tbl->refs_control, uVar2 < 0x10000000) {
        LOCK();
        bVar8 = uVar2 == tbl->refs_control;
        if (bVar8) {
          tbl->refs_control = uVar2 | 0x80000000;
        }
        UNLOCK();
        if (bVar8) {
          do {
          } while( true );
        }
      }
      do {
        iVar7 = protect_resize_help(tbl);
      } while (iVar7 != 0);
      do {
        while (uVar2 = tbl->refs_control, 0xfffffff < uVar2) {
          do {
            iVar7 = protect_resize_help(tbl);
          } while (iVar7 != 0);
        }
        LOCK();
        bVar8 = uVar2 == tbl->refs_control;
        if (bVar8) {
          tbl->refs_control = uVar2 + 1;
        }
        UNLOCK();
      } while (!bVar8);
    }
    else {
      LOCK();
      uVar1 = *puVar6;
      if (uVar1 == 0x7fffffffffffffff) {
        *puVar6 = a;
      }
      UNLOCK();
      if (uVar1 == 0x7fffffffffffffff) {
        do {
          uVar3 = tbl->refs_control;
          LOCK();
          bVar8 = uVar3 == tbl->refs_control;
          if (bVar8) {
            tbl->refs_control = uVar3 - 1;
          }
          UNLOCK();
        } while (!bVar8);
        return;
      }
    }
  } while( true );
}

Assistant:

void
protect_up(refs_table_t *tbl, uint64_t a)
{
    _Atomic(uint64_t)* bucket;
    _Atomic(uint64_t)* ts_bucket;
    uint64_t v;
    int i;

    protect_enter(tbl);

ref_retry:
    bucket = tbl->refs_table + (fnvhash8(a) & (tbl->refs_size - 1));
    ts_bucket = NULL; // tombstone
    i = 128; // try 128 times linear probing

    while (i--) {
ref_restart:
        v = *bucket;
        if (v == refs_ts) {
            if (ts_bucket == NULL) ts_bucket = bucket;
        } else if (v == 0) {
            // go go go
            if (ts_bucket != NULL) {
                v = refs_ts;
                if (atomic_compare_exchange_weak(ts_bucket, &v, a)) {
                    protect_leave(tbl);
                    return;
                } else {
                    goto ref_retry;
                }
            } else {
                if (atomic_compare_exchange_weak(bucket, &v, a)) {
                    protect_leave(tbl);
                    return;
                } else {
                    goto ref_restart;
                }
            }
        }

        if (++bucket == tbl->refs_table + tbl->refs_size) bucket = tbl->refs_table;
    }

    // not found after linear probing
    if (ts_bucket != NULL) {
        v = refs_ts;
        if (atomic_compare_exchange_weak(ts_bucket, &v, a)) {
            protect_leave(tbl);
            return;
        } else {
            goto ref_retry;
        }
    } else {
        // hash table full
        protect_leave(tbl);
        protect_resize(tbl);
        protect_enter(tbl);
        goto ref_retry;
    }
}